

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

Graph * __thiscall Graph::returnCopy(Graph *this)

{
  int iVar1;
  Edge *pEVar2;
  Graph *this_00;
  int idLoadFactor;
  int idLoadFactor_00;
  Vertex *pVVar3;
  Edge **ppEVar4;
  double dVar5;
  double dVar6;
  
  this_00 = (Graph *)operator_new(0x88);
  Graph(this_00);
  pVVar3 = this->verticesList;
  while (pVVar3 = pVVar3->nextVertex, pVVar3 != (Vertex *)0x0) {
    iVar1 = pVVar3->id;
    dVar5 = Vertex::getActivePower(pVVar3);
    dVar6 = Vertex::getReactivePower(pVVar3);
    insertVertex(this_00,iVar1,dVar5,dVar6,pVVar3->voltage,idLoadFactor);
  }
  pVVar3 = this->verticesList;
  iVar1 = pVVar3->id;
  dVar5 = Vertex::getActivePower(pVVar3);
  dVar6 = Vertex::getReactivePower(pVVar3);
  insertVertex(this_00,iVar1,dVar5,dVar6,pVVar3->voltage,idLoadFactor_00);
  while (pVVar3 = this->verticesList, pVVar3 != (Vertex *)0x0) {
    ppEVar4 = &pVVar3->edgesList;
    while (pEVar2 = *ppEVar4, pEVar2 != (Edge *)0x0) {
      insertEdge(this_00,pEVar2->origin->id,pEVar2->destiny->id,pEVar2->id,pEVar2->resistance,
                 pEVar2->reactance,pEVar2->closed);
      ppEVar4 = &pEVar2->nextEdge;
    }
    this = (Graph *)&pVVar3->nextVertex;
  }
  return this_00;
}

Assistant:

Graph *Graph::returnCopy(){
    Graph *g = new Graph();
    int originId, destinyId, edgeId, vertexId;
    double resist, react, activePower, reactivePower, voltage;

    for(Vertex *no= this->verticesList->getNext(); no!=NULL; no= no->getNext()){
        vertexId = no->getID();
        activePower = no->getActivePower();
        reactivePower = no->getReactivePower();
        voltage = no->getVoltage();

        g->insertVertex(vertexId, activePower, reactivePower, voltage);
    }

    //inserindo no fonte por ultimo pos a funcao que insere nós insere sempre no inicio da lista, assim o nó fonte fica no inicio da lista
    Vertex *source = this->verticesList;
    g->insertVertex(source->getID(), source->getActivePower(), source->getReactivePower(), source->getVoltage());

    for(Vertex *v=this->verticesList; v!=NULL; v= v->getNext()){
         for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){
            originId = e->getOrigin()->getID();
            destinyId = e->getDestiny()->getID();
            edgeId = e->getID();
            resist = e->getResistance();
            react = e->getReactance();

             g->insertEdge(originId, destinyId, edgeId, resist, react, e->isClosed());
        }
    }
    return g;
}